

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcMulti.c
# Opt level: O0

Abc_Ntk_t *
Abc_NtkMulti(Abc_Ntk_t *pNtk,int nThresh,int nFaninMax,int fCnf,int fMulti,int fSimple,int fFactor)

{
  int iVar1;
  Abc_Ntk_t *pAVar2;
  Abc_Ntk_t *pNtkNew;
  int fSimple_local;
  int fMulti_local;
  int fCnf_local;
  int nFaninMax_local;
  int nThresh_local;
  Abc_Ntk_t *pNtk_local;
  
  iVar1 = Abc_NtkIsStrash(pNtk);
  if (iVar1 == 0) {
    __assert_fail("Abc_NtkIsStrash(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcMulti.c"
                  ,0x44,"Abc_Ntk_t *Abc_NtkMulti(Abc_Ntk_t *, int, int, int, int, int, int)");
  }
  if (-1 < nThresh) {
    if (1 < nFaninMax) {
      iVar1 = Abc_NtkGetChoiceNum(pNtk);
      if (iVar1 != 0) {
        printf("Warning: The choice nodes in the AIG are removed by renoding.\n");
      }
      if (fCnf == 0) {
        if (fMulti == 0) {
          if (fSimple == 0) {
            if (fFactor == 0) {
              Abc_NtkMultiSetBounds(pNtk,nThresh,nFaninMax);
            }
            else {
              Abc_NtkMultiSetBoundsFactor(pNtk);
            }
          }
          else {
            Abc_NtkMultiSetBoundsSimple(pNtk);
          }
        }
        else {
          Abc_NtkMultiSetBoundsMulti(pNtk,nThresh);
        }
      }
      else {
        Abc_NtkMultiSetBoundsCnf(pNtk);
      }
      pNtk_local = Abc_NtkStartFrom(pNtk,ABC_NTK_LOGIC,ABC_FUNC_BDD);
      Abc_NtkMultiInt(pNtk,pNtk_local);
      Abc_NtkFinalize(pNtk,pNtk_local);
      Abc_NtkMinimumBase(pNtk_local);
      Abc_NtkLogicMakeSimpleCos(pNtk_local,0);
      if (pNtk->pExdc != (Abc_Ntk_t *)0x0) {
        pAVar2 = Abc_NtkDup(pNtk->pExdc);
        pNtk_local->pExdc = pAVar2;
      }
      iVar1 = Abc_NtkCheck(pNtk_local);
      if (iVar1 == 0) {
        printf("Abc_NtkMulti: The network check has failed.\n");
        Abc_NtkDelete(pNtk_local);
        pNtk_local = (Abc_Ntk_t *)0x0;
      }
      return pNtk_local;
    }
    __assert_fail("nFaninMax > 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcMulti.c"
                  ,0x46,"Abc_Ntk_t *Abc_NtkMulti(Abc_Ntk_t *, int, int, int, int, int, int)");
  }
  __assert_fail("nThresh >= 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcMulti.c"
                ,0x45,"Abc_Ntk_t *Abc_NtkMulti(Abc_Ntk_t *, int, int, int, int, int, int)");
}

Assistant:

Abc_Ntk_t * Abc_NtkMulti( Abc_Ntk_t * pNtk, int nThresh, int nFaninMax, int fCnf, int fMulti, int fSimple, int fFactor )
{
    Abc_Ntk_t * pNtkNew;

    assert( Abc_NtkIsStrash(pNtk) );
    assert( nThresh >= 0 );
    assert( nFaninMax > 1 );

    // print a warning about choice nodes
    if ( Abc_NtkGetChoiceNum( pNtk ) )
        printf( "Warning: The choice nodes in the AIG are removed by renoding.\n" );

    // define the boundary
    if ( fCnf )
        Abc_NtkMultiSetBoundsCnf( pNtk );
    else if ( fMulti )
        Abc_NtkMultiSetBoundsMulti( pNtk, nThresh );
    else if ( fSimple )
        Abc_NtkMultiSetBoundsSimple( pNtk );
    else if ( fFactor )
        Abc_NtkMultiSetBoundsFactor( pNtk );
    else
        Abc_NtkMultiSetBounds( pNtk, nThresh, nFaninMax );

    // perform renoding for this boundary
    pNtkNew = Abc_NtkStartFrom( pNtk, ABC_NTK_LOGIC, ABC_FUNC_BDD );
    Abc_NtkMultiInt( pNtk, pNtkNew );
    Abc_NtkFinalize( pNtk, pNtkNew );

    // make the network minimum base
    Abc_NtkMinimumBase( pNtkNew );

    // fix the problem with complemented and duplicated CO edges
    Abc_NtkLogicMakeSimpleCos( pNtkNew, 0 );

    // report the number of CNF objects
    if ( fCnf )
    {
//        int nClauses = Abc_NtkGetClauseNum(pNtkNew) + 2*Abc_NtkPoNum(pNtkNew) + 2*Abc_NtkLatchNum(pNtkNew);
//        printf( "CNF variables = %d. CNF clauses = %d.\n",  Abc_NtkNodeNum(pNtkNew), nClauses );
    }
//printf( "Maximum fanin = %d.\n", Abc_NtkGetFaninMax(pNtkNew) );

    if ( pNtk->pExdc )
        pNtkNew->pExdc = Abc_NtkDup( pNtk->pExdc );
    // make sure everything is okay
    if ( !Abc_NtkCheck( pNtkNew ) )
    {
        printf( "Abc_NtkMulti: The network check has failed.\n" );
        Abc_NtkDelete( pNtkNew );
        return NULL;
    }
    return pNtkNew;
}